

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  uint *puVar1;
  int i;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  DataKey DVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar8 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->infeasibilities).super_IdxSet.num;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    do {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      pnVar3 = (pSVar2->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      i = (pSVar2->infeasibilities).super_IdxSet.idx[lVar8 + -2];
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[i].m_backend.data + 0x20);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[i].m_backend.data;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[i].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[i].m_backend.data + 0x10);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar5 = *(undefined8 *)(puVar1 + 2);
      local_a8.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_a8.exp = pnVar3[i].m_backend.exp;
      local_a8.neg = pnVar3[i].m_backend.neg;
      local_a8.fpclass = pnVar3[i].m_backend.fpclass;
      local_a8.prec_elem = pnVar3[i].m_backend.prec_elem;
      local_68.data._M_elems._32_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 8);
      local_68.data._M_elems._0_8_ =
           *(undefined8 *)
            (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems;
      local_68.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 2);
      local_68.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 4);
      local_68.data._M_elems._24_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 6);
      local_68.exp = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.exp;
      local_68.neg = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.neg;
      local_68.fpclass =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.fpclass;
      local_68.prec_elem =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.prec_elem;
      if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
        local_68.neg = (bool)(local_68.neg ^ 1);
      }
      if ((local_68.fpclass == cpp_dec_float_NaN || local_a8.fpclass == cpp_dec_float_NaN) ||
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_a8,&local_68), -1 < iVar6)) {
        pSVar2 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar4 = (pSVar2->infeasibilities).super_IdxSet.idx;
        iVar6 = (pSVar2->infeasibilities).super_IdxSet.num;
        (pSVar2->infeasibilities).super_IdxSet.num = iVar6 + -1;
        piVar4[lVar8 + -2] = piVar4[(long)iVar6 + -1];
        (pSVar2->isInfeasible).data[i] = 0;
      }
      else if (((local_a8.fpclass != cpp_dec_float_NaN) &&
               ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
              (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_a8,&best->m_backend), iVar6 < 0)) {
        DVar7 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::coId((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver,i);
        enterId->super_DataKey = DVar7;
        *(undefined8 *)(best->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
        *(undefined8 *)((best->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_;
        *(undefined8 *)((best->m_backend).data._M_elems + 4) = local_a8.data._M_elems._16_8_;
        *(ulong *)((best->m_backend).data._M_elems + 6) =
             CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
        *(undefined8 *)((best->m_backend).data._M_elems + 8) = local_a8.data._M_elems._32_8_;
        (best->m_backend).exp = local_a8.exp;
        (best->m_backend).neg = local_a8.neg;
        (best->m_backend).fpclass = local_a8.fpclass;
        (best->m_backend).prec_elem = local_a8.prec_elem;
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = this->thesolver->coTest()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->coId(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);

         assert(this->thesolver->isInfeasible[idx]);
         this->thesolver->isInfeasible[idx] = 0;
      }
   }

   return enterId;
}